

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O3

typed_value<std::vector<bool,_std::allocator<bool>_>,_char> * __thiscall
VW::config::options_boost_po::convert_to_boost_value<bool>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<bool>_> *opt)

{
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *ptVar1;
  vw_exception *this_00;
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  stringstream __msg;
  allocator_type local_1ca;
  bool local_1c9;
  string local_1c8;
  undefined1 local_1a8 [392];
  
  ptVar1 = get_base_boost_value<bool>(this,opt);
  if ((((opt->super___shared_ptr<VW::config::typed_option<bool>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
       )->m_default_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_1c9 = false;
    __l._M_len = 1;
    __l._M_array = &local_1c9;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_1a8,__l,&local_1ca);
    boost::program_options::typed_value<std::vector<bool,_std::allocator<bool>_>,_char>::
    default_value(ptVar1,(vector<bool,_std::allocator<bool>_> *)local_1a8);
    if ((_Bit_type *)local_1a8._0_8_ != (_Bit_type *)0x0) {
      operator_delete((void *)local_1a8._0_8_);
    }
    ptVar1->m_zero_tokens = true;
    local_1c9 = true;
    __l_00._M_len = 1;
    __l_00._M_array = &local_1c9;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_1a8,__l_00,&local_1ca);
    boost::program_options::typed_value<std::vector<bool,_std::allocator<bool>_>,_char>::
    implicit_value(ptVar1,(vector<bool,_std::allocator<bool>_> *)local_1a8);
    if ((_Bit_type *)local_1a8._0_8_ != (_Bit_type *)0x0) {
      operator_delete((void *)local_1a8._0_8_);
    }
    ptVar1 = add_notifier<bool>(this,opt,ptVar1);
    return ptVar1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a8 + 0x10),
             "Using a bool option type acts as a switch, no explicit default value is allowed.",0x50
            );
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/options_boost_po.cc"
             ,0x11,&local_1c8);
  __cxa_throw(this_00,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

po::typed_value<std::vector<bool>>* options_boost_po::convert_to_boost_value(std::shared_ptr<typed_option<bool>>& opt)
{
  auto value = get_base_boost_value(opt);

  if (opt->default_value_supplied())
  {
    THROW("Using a bool option type acts as a switch, no explicit default value is allowed.")
  }

  value->default_value({false});
  value->zero_tokens();
  value->implicit_value({true});

  return add_notifier(opt, value);
}